

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_f5ee20::HandleScriptMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  _Hash_node_base **pp_Var1;
  undefined8 uVar2;
  __node_base_ptr p_Var3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  __node_base_ptr p_Var6;
  const_reference pvVar7;
  undefined1 *puVar8;
  string *a;
  cmGlobalGenerator *this;
  string_view str;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  undefined1 local_1d8 [23];
  undefined1 local_1c1;
  undefined1 local_1c0 [8];
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_1b8;
  undefined1 local_1b0 [8];
  string *code;
  undefined1 local_191;
  undefined1 local_190 [8];
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_188;
  allocator<char> local_179;
  string local_178;
  char local_151;
  string local_150;
  string_view local_130;
  undefined1 local_120 [8];
  string script;
  string *arg;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_d8;
  int local_b8;
  allocator<char> local_b1;
  string local_b0;
  __node_base_ptr local_90;
  size_t i;
  int local_80;
  bool all_components;
  bool exclude_from_all;
  bool doing_code;
  bool doing_script;
  int componentCount;
  undefined1 local_70 [8];
  string component;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)((long)&component.field_2 + 8),status);
  std::__cxx11::string::string((string *)local_70,(string *)&helper.Makefile);
  local_80 = 0;
  i._7_1_ = 0;
  i._6_1_ = 0;
  i._5_1_ = 0;
  i._4_1_ = 0;
  for (local_90 = (__node_base_ptr)0x0; p_Var3 = local_90,
      p_Var6 = (__node_base_ptr)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(args), uVar2 = helper.DefaultComponentName.field_2._8_8_, p_Var3 < p_Var6;
      local_90 = (__node_base_ptr)((long)&local_90->_M_nxt + 1)) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(size_type)local_90);
    bVar5 = std::operator==(pvVar7,"COMPONENT");
    if ((bVar5) &&
       (pp_Var1 = &local_90->_M_nxt,
       puVar8 = (undefined1 *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(args), (undefined1 *)((long)pp_Var1 + 1U) < puVar8)) {
      local_80 = local_80 + 1;
      local_90 = (__node_base_ptr)((long)&local_90->_M_nxt + 1);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(size_type)local_90);
      std::__cxx11::string::operator=((string *)local_70,(string *)pvVar7);
    }
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(size_type)local_90);
    bVar5 = std::operator==(pvVar7,"EXCLUDE_FROM_ALL");
    if (bVar5) {
      i._5_1_ = 1;
    }
    else {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(size_type)local_90);
      bVar5 = std::operator==(pvVar7,"ALL_COMPONENTS");
      if (bVar5) {
        i._4_1_ = 1;
      }
    }
  }
  if (local_80 < 2) {
    if (((i._4_1_ & 1) == 0) || (local_80 != 1)) {
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(args);
      arg = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(args);
      while( true ) {
        bVar5 = __gnu_cxx::operator!=
                          (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&arg);
        uVar2 = helper.DefaultComponentName.field_2._8_8_;
        if (!bVar5) break;
        script.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )script.field_2._8_8_,"SCRIPT");
        if (bVar5) {
          i._7_1_ = 1;
          i._6_1_ = 0;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)script.field_2._8_8_,"CODE");
          if (bVar5) {
            i._7_1_ = 0;
            i._6_1_ = 1;
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)script.field_2._8_8_,"COMPONENT");
            pcVar4 = helper.Status;
            uVar2 = script.field_2._8_8_;
            if (bVar5) {
              i._7_1_ = 0;
              i._6_1_ = 0;
            }
            else if ((i._7_1_ & 1) == 0) {
              if ((i._6_1_ & 1) != 0) {
                i._6_1_ = 0;
                local_1b0 = (undefined1  [8])script.field_2._8_8_;
                local_1c1 = (_Alloc_hider)0x1;
                cmMakefile::GetBacktrace((cmMakefile *)local_1d8);
                std::
                make_unique<cmInstallScriptGenerator,std::__cxx11::string_const&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1c0,(bool *)uVar2,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1c1,(bool *)local_70,(bool *)((long)&i + 5),
                           (cmListFileBacktrace *)((long)&i + 4));
                std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
                unique_ptr<cmInstallScriptGenerator,std::default_delete<cmInstallScriptGenerator>,void>
                          ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *
                           )&local_1b8,
                           (unique_ptr<cmInstallScriptGenerator,_std::default_delete<cmInstallScriptGenerator>_>
                            *)local_1c0);
                cmMakefile::AddInstallGenerator((cmMakefile *)pcVar4,&local_1b8);
                std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
                ~unique_ptr(&local_1b8);
                std::
                unique_ptr<cmInstallScriptGenerator,_std::default_delete<cmInstallScriptGenerator>_>
                ::~unique_ptr((unique_ptr<cmInstallScriptGenerator,_std::default_delete<cmInstallScriptGenerator>_>
                               *)local_1c0);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_1d8);
              }
            }
            else {
              i._7_1_ = 0;
              std::__cxx11::string::string((string *)local_120,(string *)script.field_2._8_8_);
              str = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_120);
              local_130 = str;
              bVar5 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])"$<INSTALL_PREFIX>");
              if (bVar5) {
LAB_008072d0:
                pcVar4 = helper.Status;
                local_191 = (_Alloc_hider)0x0;
                cmMakefile::GetBacktrace((cmMakefile *)&code);
                std::
                make_unique<cmInstallScriptGenerator,std::__cxx11::string&,bool,std::__cxx11::string&,bool&,bool&,cmListFileBacktrace>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_190,(bool *)local_120,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_191,(bool *)local_70,(bool *)((long)&i + 5),
                           (cmListFileBacktrace *)((long)&i + 4));
                std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
                unique_ptr<cmInstallScriptGenerator,std::default_delete<cmInstallScriptGenerator>,void>
                          ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *
                           )&local_188,
                           (unique_ptr<cmInstallScriptGenerator,_std::default_delete<cmInstallScriptGenerator>_>
                            *)local_190);
                cmMakefile::AddInstallGenerator((cmMakefile *)pcVar4,&local_188);
                std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
                ~unique_ptr(&local_188);
                std::
                unique_ptr<cmInstallScriptGenerator,_std::default_delete<cmInstallScriptGenerator>_>
                ::~unique_ptr((unique_ptr<cmInstallScriptGenerator,_std::default_delete<cmInstallScriptGenerator>_>
                               *)local_190);
                cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&code);
                local_b8 = 0;
              }
              else {
                bVar5 = cmsys::SystemTools::FileIsFullPath((string *)local_120);
                if (!bVar5) {
                  a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)helper.Status);
                  local_151 = '/';
                  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                            (&local_150,a,&local_151,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             script.field_2._8_8_);
                  std::__cxx11::string::operator=((string *)local_120,(string *)&local_150);
                  std::__cxx11::string::~string((string *)&local_150);
                }
                bVar5 = cmsys::SystemTools::FileIsDirectory((string *)local_120);
                uVar2 = helper.DefaultComponentName.field_2._8_8_;
                if (!bVar5) goto LAB_008072d0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_178,"given a directory as value of SCRIPT argument.",
                           &local_179);
                cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_178);
                std::__cxx11::string::~string((string *)&local_178);
                std::allocator<char>::~allocator(&local_179);
                args_local._7_1_ = 0;
                local_b8 = 1;
              }
              std::__cxx11::string::~string((string *)local_120);
              if (local_b8 != 0) goto LAB_008076ce;
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      if ((i._7_1_ & 1) == 0) {
        if ((i._6_1_ & 1) == 0) {
          this = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
          cmGlobalGenerator::AddInstallComponent(this,(string *)local_70);
          args_local._7_1_ = 1;
          local_b8 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,"given no value for CODE argument.",&local_221);
          cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
          args_local._7_1_ = 0;
          local_b8 = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"given no value for SCRIPT argument.",&local_1f9);
        cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        args_local._7_1_ = 0;
        local_b8 = 1;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"ALL_COMPONENTS and COMPONENT are mutually exclusive",
                 (allocator<char> *)((long)&__range1 + 7));
      cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      args_local._7_1_ = 0;
      local_b8 = 1;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,
               "given more than one COMPONENT for the SCRIPT or CODE signature of the INSTALL command. Use multiple INSTALL commands with one COMPONENT each."
               ,&local_b1);
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar2,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    args_local._7_1_ = 0;
    local_b8 = 1;
  }
LAB_008076ce:
  std::__cxx11::string::~string((string *)local_70);
  Helper::~Helper((Helper *)((long)&component.field_2 + 8));
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleScriptMode(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  Helper helper(status);

  std::string component = helper.DefaultComponentName;
  int componentCount = 0;
  bool doing_script = false;
  bool doing_code = false;
  bool exclude_from_all = false;
  bool all_components = false;

  // Scan the args once for COMPONENT. Only allow one.
  //
  for (size_t i = 0; i < args.size(); ++i) {
    if (args[i] == "COMPONENT" && i + 1 < args.size()) {
      ++componentCount;
      ++i;
      component = args[i];
    }
    if (args[i] == "EXCLUDE_FROM_ALL") {
      exclude_from_all = true;
    } else if (args[i] == "ALL_COMPONENTS") {
      all_components = true;
    }
  }

  if (componentCount > 1) {
    status.SetError("given more than one COMPONENT for the SCRIPT or CODE "
                    "signature of the INSTALL command. "
                    "Use multiple INSTALL commands with one COMPONENT each.");
    return false;
  }

  if (all_components && componentCount == 1) {
    status.SetError("ALL_COMPONENTS and COMPONENT are mutually exclusive");
    return false;
  }

  // Scan the args again, this time adding install generators each time we
  // encounter a SCRIPT or CODE arg:
  //
  for (std::string const& arg : args) {
    if (arg == "SCRIPT") {
      doing_script = true;
      doing_code = false;
    } else if (arg == "CODE") {
      doing_script = false;
      doing_code = true;
    } else if (arg == "COMPONENT") {
      doing_script = false;
      doing_code = false;
    } else if (doing_script) {
      doing_script = false;
      std::string script = arg;
      if (!cmHasLiteralPrefix(script, "$<INSTALL_PREFIX>")) {
        if (!cmSystemTools::FileIsFullPath(script)) {
          script =
            cmStrCat(helper.Makefile->GetCurrentSourceDirectory(), '/', arg);
        }
        if (cmSystemTools::FileIsDirectory(script)) {
          status.SetError("given a directory as value of SCRIPT argument.");
          return false;
        }
      }
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          script, false, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    } else if (doing_code) {
      doing_code = false;
      std::string const& code = arg;
      helper.Makefile->AddInstallGenerator(
        cm::make_unique<cmInstallScriptGenerator>(
          code, true, component, exclude_from_all, all_components,
          helper.Makefile->GetBacktrace()));
    }
  }

  if (doing_script) {
    status.SetError("given no value for SCRIPT argument.");
    return false;
  }
  if (doing_code) {
    status.SetError("given no value for CODE argument.");
    return false;
  }

  // Tell the global generator about any installation component names
  // specified.
  helper.Makefile->GetGlobalGenerator()->AddInstallComponent(component);

  return true;
}